

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::repairencfacs(tetgenmesh *this,int chkencflag)

{
  int iVar1;
  bool bVar2;
  double local_48;
  double ccent [3];
  point pdStack_28;
  int qflag;
  point encpt;
  face *bface;
  tetgenmesh *ptStack_10;
  int chkencflag_local;
  tetgenmesh *this_local;
  
  pdStack_28 = (point)0x0;
  ccent[2]._4_4_ = 0;
  bface._4_4_ = chkencflag;
  ptStack_10 = this;
  while( true ) {
    bVar2 = false;
    if (0 < this->badsubfacs->items) {
      bVar2 = this->steinerleft != 0;
    }
    if (!bVar2) break;
    memorypool::traversalinit(this->badsubfacs);
    encpt = (point)memorypool::traverse(this->badsubfacs);
    while( true ) {
      bVar2 = false;
      if (encpt != (point)0x0) {
        bVar2 = this->steinerleft != 0;
      }
      if (!bVar2) break;
      if (-1 < *(int *)(encpt + 1)) {
        if (((*encpt != 0.0) && (*(long *)((long)*encpt + 0x18) != 0)) &&
           (bVar2 = smarktest2ed(this,(face *)encpt), bVar2)) {
          sunmarktest2(this,(face *)encpt);
          iVar1 = checkfac4split(this,(face *)encpt,&stack0xffffffffffffffd8,
                                 (int *)((long)ccent + 0x14),&local_48);
          if (iVar1 != 0) {
            splitsubface(this,(face *)encpt,pdStack_28,(point)0x0,ccent[2]._4_4_,&local_48,
                         bface._4_4_);
          }
        }
        *(undefined4 *)(encpt + 1) = 0xffffffff;
        memorypool::dealloc(this->badsubfacs,encpt);
      }
      encpt = (point)memorypool::traverse(this->badsubfacs);
    }
  }
  if (0 < this->badsubfacs->items) {
    if (this->steinerleft == 0) {
      if (this->b->verbose != 0) {
        printf("The desired number of Steiner points is reached.\n");
      }
    }
    else {
      terminatetetgen(this,2);
    }
    memorypool::traversalinit(this->badsubfacs);
    encpt = (point)memorypool::traverse(this->badsubfacs);
    while (encpt != (point)0x0) {
      if ((((-1 < *(int *)(encpt + 1)) && (*encpt != 0.0)) && (*(long *)((long)*encpt + 0x18) != 0))
         && (bVar2 = smarktest2ed(this,(face *)encpt), bVar2)) {
        sunmarktest2(this,(face *)encpt);
      }
      encpt = (point)memorypool::traverse(this->badsubfacs);
    }
    memorypool::restart(this->badsubfacs);
  }
  return;
}

Assistant:

void tetgenmesh::repairencfacs(int chkencflag)
{
  face *bface;
  point encpt = NULL;
  int qflag = 0;
  REAL ccent[3];

  // Loop until the pool 'badsubfacs' is empty. Note that steinerleft == -1
  //   if an unlimited number of Steiner points is allowed.
  while ((badsubfacs->items > 0) && (steinerleft != 0)) {
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while ((bface != NULL) && (steinerleft != 0)) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        // A queued subface may have been deleted (split).
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          // A queued subface may have been processed. 
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
            if (checkfac4split(bface, encpt, qflag, ccent)) {
              splitsubface(bface, encpt, NULL, qflag, ccent, chkencflag);
            }
          }
        }
        bface->shver = -1; // Signal it as a deleted element.
        badsubfacs->dealloc((void *) bface); // Remove this entry from list.
      }
      bface = (face *) badsubfacs->traverse();
    }
  }

  if (badsubfacs->items > 0) {
    if (steinerleft == 0) {
      if (b->verbose) {
        printf("The desired number of Steiner points is reached.\n");
      }
    } else {
      terminatetetgen(this, 2);
    }
    badsubfacs->traversalinit();
    bface = (face *) badsubfacs->traverse();
    while (bface  != NULL) {
      // Skip a deleted element.
      if (bface->shver >= 0) {
        if ((bface->sh != NULL) && (bface->sh[3] != NULL)) {
          if (smarktest2ed(*bface)) {
            sunmarktest2(*bface);
          }
        }
      }
      bface = (face *) badsubfacs->traverse();
    }
    badsubfacs->restart();
  }
}